

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

bool FIX::socket_fionread(socket_handle s,int *bytes)

{
  int iVar1;
  
  *bytes = 0;
  iVar1 = ioctl(s,0x541b,bytes);
  return iVar1 == 0;
}

Assistant:

bool socket_fionread(socket_handle s, int &bytes) {
  bytes = 0;
#if defined(_MSC_VER)
  return ::ioctlsocket(s, FIONREAD, &((unsigned long &)bytes)) == 0;
#elif defined(USING_STREAMS)
  return ::ioctl(s, I_NREAD, &bytes) >= 0;
#else
  return ::ioctl(s, FIONREAD, &bytes) == 0;
#endif
}